

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O3

void __thiscall QStatusBar::QStatusBar(QStatusBar *this,QWidget *parent)

{
  long lVar1;
  QWidgetPrivate *this_00;
  
  this_00 = (QWidgetPrivate *)operator_new(0x2a8);
  QWidgetPrivate::QWidgetPrivate(this_00,QObjectPrivateVersion);
  *(undefined ***)this_00 = &PTR__QStatusBarPrivate_007fb9e8;
  *(undefined8 *)(this_00 + 1) = 0;
  *(undefined8 *)&this_00[1].field_0x8 = 0;
  *(undefined8 *)&this_00[1].field_0x10 = 0;
  *(undefined8 *)&this_00[1].field_0x18 = 0;
  *(undefined8 *)&this_00[1].field_0x20 = 0;
  *(undefined8 *)&this_00[1].field_0x28 = 0;
  QWidget::QWidget(&this->super_QWidget,this_00,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007fb748;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QStatusBar_007fb8f8;
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  *(undefined8 *)(lVar1 + 0x288) = 0;
  *(undefined8 *)(lVar1 + 0x290) = 0;
  *(undefined8 *)(lVar1 + 0x298) = 0;
  setSizeGripEnabled(this,true);
  return;
}

Assistant:

QStatusBar::QStatusBar(QWidget * parent)
    : QWidget(*new QStatusBarPrivate, parent, { })
{
    Q_D(QStatusBar);
    d->box = nullptr;
    d->timer = nullptr;

#if QT_CONFIG(sizegrip)
    d->resizer = nullptr;
    setSizeGripEnabled(true); // causes reformat()
#else
    reformat();
#endif
}